

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_getdate.c
# Opt level: O3

time_t Convert(time_t Month,time_t Day,time_t Year,time_t Hours,time_t Minutes,time_t Seconds,
              time_t Timezone,DSTMODE DSTmode)

{
  long lVar1;
  tm *ptVar2;
  byte bVar3;
  ulong uVar4;
  ulong uVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  long lVar13;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  char acStack_21 [3];
  undefined6 uStack_1e;
  undefined4 local_18;
  long local_10;
  
  local_18 = 0x1f1e1f1e;
  uVar5 = Year + 0x76c;
  if (99 < (ulong)Year) {
    uVar5 = Year;
  }
  if (Year < 0x45) {
    uVar5 = Year + 2000;
  }
  bVar3 = 0x1c;
  if ((uVar5 & 3) == 0) {
    lVar1 = uVar5 * -0x70a3d70a3d70a3d7;
    bVar3 = 0x1d;
    if ((lVar1 + 0x51eb851eb851eb8U >> 2 | lVar1 << 0x3e) < 0x28f5c28f5c28f5d) {
      bVar3 = (lVar1 + 0x51eb851eb851eb0U >> 4 | lVar1 << 0x3c) < 0xa3d70a3d70a3d7 | 0x1c;
    }
  }
  stack0xffffffffffffffe0 = CONCAT62(0x1f1f1e1f1e1f,CONCAT11(bVar3,0x1f));
  if (Day < 1) {
    return -1;
  }
  if (Month - 0xdU < 0xfffffffffffffff4) {
    return -1;
  }
  if (uVar5 - 0x7f7 < 0xffffffffffffffbb) {
    return -1;
  }
  if (0x3b < (ulong)Seconds) {
    return -1;
  }
  if (0x3b < (ulong)Minutes) {
    return -1;
  }
  if (0x17 < (ulong)Hours) {
    return -1;
  }
  if (Day <= acStack_21[Month]) {
    uVar4 = Day - 1;
    if (Month != 1) {
      lVar1 = 0;
      do {
        uVar4 = uVar4 + (long)acStack_21[lVar1 + 1];
        lVar1 = lVar1 + 1;
      } while (Month + -1 != lVar1);
    }
    if (0x7b2 < (long)uVar5) {
      lVar1 = uVar5 - 0x7b3;
      auVar6._8_8_ = 0;
      auVar6._0_8_ = uVar4;
      auVar8._8_4_ = (int)lVar1;
      auVar8._0_8_ = lVar1;
      auVar8._12_4_ = (int)((ulong)lVar1 >> 0x20);
      lVar1 = 2;
      auVar11 = _DAT_00542330;
      do {
        auVar7 = auVar6;
        auVar6 = auVar11 & _DAT_00542340;
        auVar19._0_4_ = -(uint)(auVar6._0_4_ == 0);
        auVar19._4_4_ = -(uint)(auVar6._4_4_ == 0);
        auVar19._8_4_ = -(uint)(auVar6._8_4_ == 0);
        auVar19._12_4_ = -(uint)(auVar6._12_4_ == 0);
        auVar20._4_4_ = auVar19._0_4_;
        auVar20._0_4_ = auVar19._4_4_;
        auVar20._8_4_ = auVar19._12_4_;
        auVar20._12_4_ = auVar19._8_4_;
        auVar6._0_8_ = (auVar7._0_8_ - SUB168(auVar20 & auVar19,0)) + 0x16d;
        auVar6._8_8_ = (auVar7._8_8_ - SUB168(auVar20 & auVar19,8)) + 0x16d;
        lVar13 = auVar11._8_8_;
        auVar11._0_8_ = auVar11._0_8_ + 2;
        auVar11._8_8_ = lVar13 + 2;
        lVar13 = (uVar5 - 0x7b1 & 0xfffffffffffffffe) + lVar1;
        lVar1 = lVar1 + -2;
      } while (lVar13 != 4);
      lVar1 = -lVar1;
      auVar10._8_4_ = (int)lVar1;
      auVar10._0_8_ = lVar1;
      auVar10._12_4_ = (int)((ulong)lVar1 >> 0x20);
      auVar8 = auVar8 ^ _DAT_00528d80;
      auVar11 = (auVar10 | _DAT_00528d70) ^ _DAT_00528d80;
      iVar14 = -(uint)(auVar8._0_4_ < auVar11._0_4_);
      iVar15 = -(uint)(auVar8._4_4_ < auVar11._4_4_);
      iVar16 = -(uint)(auVar8._8_4_ < auVar11._8_4_);
      iVar17 = -(uint)(auVar8._12_4_ < auVar11._12_4_);
      auVar18._4_4_ = iVar14;
      auVar18._0_4_ = iVar14;
      auVar18._8_4_ = iVar16;
      auVar18._12_4_ = iVar16;
      iVar14 = -(uint)(auVar11._4_4_ == auVar8._4_4_);
      iVar16 = -(uint)(auVar11._12_4_ == auVar8._12_4_);
      auVar9._4_4_ = iVar14;
      auVar9._0_4_ = iVar14;
      auVar9._8_4_ = iVar16;
      auVar9._12_4_ = iVar16;
      auVar12._4_4_ = iVar15;
      auVar12._0_4_ = iVar15;
      auVar12._8_4_ = iVar17;
      auVar12._12_4_ = iVar17;
      auVar12 = auVar12 | auVar9 & auVar18;
      auVar6 = ~auVar12 & auVar6 | auVar7 & auVar12;
      uVar4 = auVar6._8_8_ + auVar6._0_8_;
    }
    local_10 = Minutes * 0x3c + Hours * 0xe10 + Seconds + Timezone + uVar4 * 0x15180;
    if (DSTmode != DSTon) {
      if (DSTmode != DSTmaybe) {
        return local_10;
      }
      ptVar2 = localtime(&local_10);
      if (ptVar2->tm_isdst == 0) {
        return local_10;
      }
    }
    return local_10 + -0xe10;
  }
  return -1;
}

Assistant:

static time_t
Convert(time_t Month, time_t Day, time_t Year,
	time_t Hours, time_t Minutes, time_t Seconds,
	time_t Timezone, enum DSTMODE DSTmode)
{
	signed char DaysInMonth[12] = {
		31, 0, 31, 30, 31, 30, 31, 31, 30, 31, 30, 31
	};
	time_t	Julian;
	int	i;

	if (Year < 69)
		Year += 2000;
	else if (Year < 100)
		Year += 1900;
	DaysInMonth[1] = Year % 4 == 0 && (Year % 100 != 0 || Year % 400 == 0)
	    ? 29 : 28;
	/* Checking for 2038 bogusly assumes that time_t is 32 bits.  But
	   I'm too lazy to try to check for time_t overflow in another way.  */
	if (Year < EPOCH || Year > 2038
	    || Month < 1 || Month > 12
	    /* Lint fluff:  "conversion from long may lose accuracy" */
	    || Day < 1 || Day > DaysInMonth[(int)--Month]
	    || Hours < 0 || Hours > 23
	    || Minutes < 0 || Minutes > 59
	    || Seconds < 0 || Seconds > 59)
		return -1;

	Julian = Day - 1;
	for (i = 0; i < Month; i++)
		Julian += DaysInMonth[i];
	for (i = EPOCH; i < Year; i++)
		Julian += 365 + (i % 4 == 0);
	Julian *= DAY;
	Julian += Timezone;
	Julian += Hours * HOUR + Minutes * MINUTE + Seconds;
	if (DSTmode == DSTon
	    || (DSTmode == DSTmaybe && localtime(&Julian)->tm_isdst))
		Julian -= HOUR;
	return Julian;
}